

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void declaration(ch_compilation *comp)

{
  _Bool _Var1;
  undefined1 local_30 [8];
  ch_token name;
  ch_compilation *comp_local;
  
  name._24_8_ = comp;
  _Var1 = consume(comp,TK_ID,"Expected variable name.",(ch_token *)local_30);
  if (_Var1) {
    _Var1 = consume((ch_compilation *)name._24_8_,TK_EQ,"Expected variable initializer.",
                    (ch_token *)0x0);
    if (_Var1) {
      expression((ch_compilation *)name._24_8_);
    }
    add_variable((ch_compilation *)name._24_8_,(ch_lexeme)name._0_16_);
  }
  return;
}

Assistant:

void declaration(ch_compilation *comp) {
  ch_token name;
  if (!consume(comp, TK_ID, "Expected variable name.", &name))
    return;

  /*
    We still want the variable to be registered even if the user forgot its initializer.
    That way, it won't cause another error where the variable is said not to exist even if it was declared.
  */
  if(consume(comp, TK_EQ, "Expected variable initializer.", NULL)) {
    expression(comp);
  }

  add_variable(comp, name.lexeme);
}